

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall Lodtalk::AST::MethodHeader::~MethodHeader(MethodHeader *this)

{
  MethodHeader *this_local;
  
  ~MethodHeader(this);
  operator_delete(this);
  return;
}

Assistant:

MethodHeader::~MethodHeader()
{
	delete arguments;
}